

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# timer_test.cpp
# Opt level: O0

void __thiscall
biosoup::test::BiosoupTimerTest_Reset_Test::~BiosoupTimerTest_Reset_Test
          (BiosoupTimerTest_Reset_Test *this)

{
  BiosoupTimerTest_Reset_Test *this_local;
  
  ~BiosoupTimerTest_Reset_Test(this);
  operator_delete(this);
  return;
}

Assistant:

TEST(BiosoupTimerTest, Reset) {
  Timer t{};
  t.Start();
  std::this_thread::sleep_for(std::chrono::milliseconds(256));
  t.Reset();
  t.Stop();
  std::this_thread::sleep_for(std::chrono::milliseconds(256));
  t.Start();
  std::this_thread::sleep_for(std::chrono::milliseconds(256));
  t.Stop();
  EXPECT_TRUE(ExpectWithinInclusive(0.256, 0.384, t.elapsed_time()));
  t.Reset();
  EXPECT_EQ(0, t.elapsed_time());
}